

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

vm_obj_id_t __thiscall CVmObjClass::get_superclass(CVmObjClass *this,vm_obj_id_t param_1,int sc_idx)

{
  vm_obj_id_t vVar1;
  vm_meta_entry_t *pvVar2;
  
  pvVar2 = get_meta_entry(this);
  if (pvVar2 != (vm_meta_entry_t *)0x0) {
    vVar1 = (*pvVar2->meta_->_vptr_CVmMetaclass[9])(pvVar2->meta_,(ulong)(uint)sc_idx);
    return vVar1;
  }
  return 0;
}

Assistant:

vm_obj_id_t CVmObjClass::get_superclass(VMG_ vm_obj_id_t, int sc_idx) const
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* 
     *   if we have a valid entry, ask the metaclass object to retrieve the
     *   superclass 
     */
    if (entry != 0)
        return entry->meta_->get_supermeta(vmg_ sc_idx);
    else
        return VM_INVALID_OBJ;
}